

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall
clipp::parameter::parameter<char_const(&)[10]>(parameter *this,arg_string *str,char (*strs) [10])

{
  code *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  predicate_adapter local_58;
  
  (this->super_token<clipp::parameter>).doc_._M_dataplus._M_p =
       (pointer)&(this->super_token<clipp::parameter>).doc_.field_2;
  (this->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (this->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_token<clipp::parameter>).repeatable_ = false;
  (this->super_token<clipp::parameter>).blocking_ = false;
  (this->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = 0;
  local_78 = clipp::match::none;
  local_68 = ZEXT416(0) << 0x40;
  local_58.match_._M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_58.match_.super__Function_base._M_functor._M_unused._M_object = clipp::match::none;
  local_58.match_.super__Function_base._M_functor._8_8_ = 0;
  local_58.match_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange(std::__cxx11::string_const&)> *)&this->matcher_,&local_58);
  if (local_58.match_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.match_.super__Function_base._M_manager)
              ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
    if ((code *)local_68._0_8_ != (code *)0x0) {
      (*(code *)local_68._0_8_)(&local_78,&local_78,3);
    }
  }
  (this->label_)._M_dataplus._M_p = (pointer)&(this->label_).field_2;
  (this->label_)._M_string_length = 0;
  (this->label_).field_2._M_local_buf[0] = '\0';
  this->required_ = false;
  this->greedy_ = false;
  add_flags<std::__cxx11::string,char_const(&)[10]>(this,str,strs);
  return;
}

Assistant:

explicit
    parameter(arg_string str, Strings&&... strs):
        flags_{},
        matcher_{predicate_adapter{match::none}},
        label_{}, required_{false}, greedy_{false}
    {
        add_flags(std::move(str), std::forward<Strings>(strs)...);
    }